

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr *pSVar1;
  bool *in_RAX;
  bool *extraout_RAX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar2;
  ArrayPtr<kj::StringPtr> table_00;
  size_t local_78;
  char *local_70;
  size_t sStack_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
    local_60.maybeFunc.ptr.field_1.value.success = in_RAX;
  }
  else {
    pSVar1 = (table->rows).builder.ptr;
    local_70 = (row->content).ptr;
    sStack_68 = (row->content).size_;
    table_00.size_ = (size_t)pSVar1;
    table_00.ptr = (StringPtr *)&table->indexes;
    local_78 = pos;
    MVar2 = TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::
            insert<kj::StringPtr,kj::StringPtr>
                      ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)&local_60,table_00,
                       (long)(table->rows).builder.pos - (long)pSVar1 >> 4,(StringPtr *)pos);
    pos = (size_t)MVar2.ptr.field_1;
    if ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)local_60.maybeFunc.ptr.isSet ==
        (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1) {
      *this = (Impl<0UL,_false>)0x1;
      *(bool **)(this + 8) = local_60.maybeFunc.ptr.field_1.value.success;
    }
    else {
      local_60.maybeFunc.ptr.isSet = true;
      *this = (Impl<0UL,_false>)0x0;
      local_70 = (char *)CONCAT71(local_70._1_7_,1);
      local_60.maybeFunc.ptr.field_1.value.success = (bool *)&local_70;
      local_60.maybeFunc.ptr.field_1.value.indexObj = &table->indexes;
      local_60.maybeFunc.ptr.field_1.value.table = table;
      local_60.maybeFunc.ptr.field_1.value.pos = &local_78;
      local_60.maybeFunc.ptr.field_1.value.row = row;
      _::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
      ::~Deferred(&local_60);
      local_60.maybeFunc.ptr.field_1.value.success = extraout_RAX;
      pos = (size_t)extraout_RDX;
    }
  }
  MVar2.ptr.field_1.value = pos;
  MVar2.ptr._0_8_ = local_60.maybeFunc.ptr.field_1.value.success;
  return (Maybe<unsigned_long>)MVar2.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }